

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void __thiscall duckdb::UpdateSegment::InitializeUpdateInfo(UpdateSegment *this,idx_t vector_idx)

{
  unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true> *this_00;
  pointer __p;
  pointer pUVar1;
  ulong uVar2;
  pointer local_20;
  
  this_00 = &this->root;
  if ((this->root).super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>.
      super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl == (UpdateNode *)0x0) {
    make_uniq<duckdb::UpdateNode,duckdb::BufferManager&>
              ((duckdb *)&local_20,this->column_data->block_manager->buffer_manager);
    __p = local_20;
    local_20 = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>::reset
              ((__uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_> *)
               this_00,__p);
    ::std::unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>::~unique_ptr
              ((unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_> *)&local_20
              );
  }
  pUVar1 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::operator->
                     (this_00);
  if ((ulong)((long)(pUVar1->info).
                    super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                    .
                    super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pUVar1->info).
                    super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                    .
                    super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) <= vector_idx) {
    pUVar1 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
             operator->(this_00);
    ::std::vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>::reserve
              (&(pUVar1->info).
                super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>,
               vector_idx + 1);
    pUVar1 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
             operator->(this_00);
    for (uVar2 = (long)(pUVar1->info).
                       super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                       .
                       super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pUVar1->info).
                       super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                       .
                       super__Vector_base<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4; uVar2 <= vector_idx;
        uVar2 = uVar2 + 1) {
      pUVar1 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
               operator->(this_00);
      ::std::vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>::
      emplace_back<>(&(pUVar1->info).
                      super_vector<duckdb::UndoBufferPointer,_std::allocator<duckdb::UndoBufferPointer>_>
                    );
    }
  }
  return;
}

Assistant:

void UpdateSegment::InitializeUpdateInfo(idx_t vector_idx) {
	// create the versions for this segment, if there are none yet
	if (!root) {
		root = make_uniq<UpdateNode>(column_data.block_manager.buffer_manager);
	}
	if (vector_idx < root->info.size()) {
		return;
	}
	root->info.reserve(vector_idx + 1);
	for (idx_t i = root->info.size(); i <= vector_idx; i++) {
		root->info.emplace_back();
	}
}